

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::ParseableFunctionInfo::CleanupToReparseHelper(ParseableFunctionInfo *this)

{
  undefined1 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  FunctionInfo *pFVar5;
  
  if ((((this->super_FunctionProxy).field_0x46 & 4) != 0) &&
     ((BYTE *)this->m_dynamicInterpreterThunk != (BYTE *)0x0)) {
    ScriptContext::ReleaseDynamicAsmJsInterpreterThunk
              ((this->super_FunctionProxy).m_scriptContext,(BYTE *)this->m_dynamicInterpreterThunk,
               true);
    this->m_dynamicInterpreterThunk = (Type)0x0;
  }
  FunctionProxy::SetAuxPtr(&this->super_FunctionProxy,ScopeInfo,(void *)0x0);
  this->scopeSlotArraySize = 0;
  this->paramScopeSlotArraySize = 0;
  FunctionProxy::SetAuxPtr(&this->super_FunctionProxy,PropertyIdsForScopeSlotArray,(void *)0x0);
  (((this->super_FunctionProxy).m_utf8SourceInfo.ptr)->m_lineOffsetCache).ptr =
       (LineOffsetCache *)0x0;
  pFVar5 = (this->super_FunctionProxy).functionInfo.ptr;
  if (pFVar5 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x568,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_00769fd5;
    *puVar4 = 0;
    pFVar5 = (this->super_FunctionProxy).functionInfo.ptr;
  }
  if ((ParseableFunctionInfo *)(pFVar5->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x569,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) {
LAB_00769fd5:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    pFVar5 = (this->super_FunctionProxy).functionInfo.ptr;
  }
  this->flags = ~(byte)(pFVar5->attributes >> 4) & Flags_HasNoExplicitReturnValue;
  this->m_inParamCount = 0;
  this->m_reportedInParamCount = 0;
  puVar1 = &(this->super_FunctionProxy).field_0x46;
  *puVar1 = *puVar1 & 0xf9;
  return;
}

Assistant:

void ParseableFunctionInfo::CleanupToReparseHelper()
    {
#if DYNAMIC_INTERPRETER_THUNK
        if (m_isAsmJsFunction && m_dynamicInterpreterThunk)
        {
            m_scriptContext->ReleaseDynamicAsmJsInterpreterThunk((BYTE*)this->m_dynamicInterpreterThunk, true);
            this->m_dynamicInterpreterThunk = nullptr;
        }
#endif

        this->SetScopeInfo(nullptr);
        this->SetPropertyIdsForScopeSlotArray(nullptr, 0);

        this->GetUtf8SourceInfo()->DeleteLineOffsetCache();

        // Reset to default.
        this->flags = this->IsClassConstructor() ? Flags_None : Flags_HasNoExplicitReturnValue;

        ResetInParams();

        this->m_isAsmjsMode = false;
        this->m_isAsmJsFunction = false;
    }